

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O2

bool __thiscall FormatTypeHFE::CanLoad(FormatTypeHFE *this,char *file_path)

{
  FILE *__stream;
  bool bVar1;
  uchar header [8];
  
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    header[0] = '\0';
    header[1] = '\0';
    header[2] = '\0';
    header[3] = '\0';
    header[4] = '\0';
    header[5] = '\0';
    header[6] = '\0';
    header[7] = '\0';
    fread(header,1,8,__stream);
    bVar1 = header == (uchar  [8])0x4546434950435848;
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

bool FormatTypeHFE::CanLoad(const char* file_path)
{
   // Check HXCPICFE version 
   FILE* file;
   bool can_load = false;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      // Check for type of file from header
      unsigned char header[0x8] = {0};
      // check the 22 first char
      fread(header, 1, 0x8, file);
      if (memcmp(header, "HXCPICFE", 8) == 0)
      {
         can_load = true;
      }
      fclose(file);
   }
   return can_load;
}